

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_query.cpp
# Opt level: O1

unique_ptr<cmake,_std::default_delete<cmake>_> __thiscall
cmakels::cmake_query::instantiate_cmake(cmake_query *this,path *root_dir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char cVar3;
  cmake *pcVar4;
  runtime_error *this_00;
  path cmake_exe_in_build_tree;
  string local_68;
  path local_48;
  
  pcVar4 = (cmake *)operator_new(0x388);
  cmake::cmake(pcVar4,RoleProject,Project);
  (this->root_dir_)._M_pathname._M_dataplus._M_p = (pointer)pcVar4;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             config::cmake_exe_path_abi_cxx11_,auto_format);
  cVar3 = std::filesystem::status(&local_48);
  if ((cVar3 != '\0') && (cVar3 != -1)) {
    paVar1 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,local_48._M_pathname._M_dataplus._M_p,
               local_48._M_pathname._M_dataplus._M_p + local_48._M_pathname._M_string_length);
    cmSystemTools::FindCMakeResources(local_68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = (cmake *)(this->root_dir_)._M_pathname._M_dataplus._M_p;
    pcVar2 = (root_dir->_M_pathname)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,pcVar2,pcVar2 + (root_dir->_M_pathname)._M_string_length);
    cmake::SetHomeDirectory(pcVar4,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path(&local_48);
    return (__uniq_ptr_data<cmake,_std::default_delete<cmake>,_true,_true>)
           (__uniq_ptr_data<cmake,_std::default_delete<cmake>,_true,_true>)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Couldn\'t find CMake resources.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<cmake> instantiate_cmake(fs::path root_dir) {
  auto my_cmake = std::make_unique<cmake>(cmake::RoleProject, cmState::Project);

  // TODO the following is a hack for the weird global state that CMake needs
  // to initialize, probably we should avoid using FindCMakeResources and try
  // to initialize the relevant parts by hand
  fs::path cmake_exe_in_build_tree = config::cmake_exe_path;
  // TODO fix for install
  // fs::path cmake_exe_in_install_tree =
  //     cmakels_dir.parent_path().parent_path() / "bin/cmake.exe";

  // string().c_str() to convert path to const char* on win, see
  // https://stackoverflow.com/a/54109263/5085250
  if (fs::exists(cmake_exe_in_build_tree))
    cmSystemTools::FindCMakeResources(cmake_exe_in_build_tree.string().c_str());
  // else if (fs::exists(cmake_exe_in_install_tree))
  //   cmSystemTools::FindCMakeResources(cmake_exe_in_install_tree.string().c_str());
  else
    throw std::runtime_error("Couldn't find CMake resources.");

  my_cmake->SetHomeDirectory(root_dir.string());
  return my_cmake;
}